

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat __thiscall Mat::GaussLin(Mat *this,Mat *rhs,int n)

{
  int iVar1;
  ostream *this_00;
  double *pdVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  Mat *this_01;
  double *extraout_RDX;
  Mat *pMVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Mat MVar4;
  Mat local_90;
  int local_7c;
  double dStack_78;
  int j_2;
  double s;
  int i_2;
  int local_64;
  int j_1;
  int i_1;
  int j;
  int i;
  int l;
  int k;
  double m;
  undefined1 local_38 [8];
  Mat Aux;
  int n_local;
  Mat *rhs_local;
  Mat *this_local;
  Mat *X;
  
  this_01 = (Mat *)CONCAT44(in_register_00000014,n);
  Aux.v_._4_4_ = in_ECX;
  Mat((Mat *)local_38,rhs);
  iVar1 = Size(this_01);
  if (local_38._0_4_ != iVar1) {
    this_00 = std::operator<<((ostream *)&std::cerr,"ERROR: Invalid dimension in gaussLin");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  for (i = 0; i < Aux.v_._4_4_ + -1; i = i + 1) {
    j = i;
    i_1 = i;
    while (i_1 = i_1 + 1, i_1 < Aux.v_._4_4_) {
      pMVar3 = (Mat *)local_38;
      operator()(pMVar3,i_1,i);
      std::abs((int)pMVar3);
      pMVar3 = (Mat *)local_38;
      operator()(pMVar3,j,i);
      std::abs((int)pMVar3);
      if (extraout_XMM0_Qa_00 < extraout_XMM0_Qa) {
        j = i_1;
      }
    }
    iVar1 = i;
    if (j != i) {
      for (j_1 = i; j_1 < Aux.v_._4_4_; j_1 = j_1 + 1) {
        pdVar2 = operator()((Mat *)local_38,i,j_1);
        _l = *pdVar2;
        *(undefined8 *)(Aux._0_8_ + (long)(i * rhs->n_cols_ + j_1) * 8) =
             *(undefined8 *)(Aux._0_8_ + (long)(j * rhs->n_cols_ + j_1) * 8);
        *(double *)(Aux._0_8_ + (long)(j * rhs->n_cols_ + j_1) * 8) = _l;
      }
      _l = this_01->v_[i];
      this_01->v_[i] = this_01->v_[j];
      this_01->v_[j] = _l;
      iVar1 = i;
    }
    while (local_64 = iVar1 + 1, local_64 < Aux.v_._4_4_) {
      _l = *(double *)(Aux._0_8_ + (long)(local_64 * rhs->n_cols_ + i) * 8) /
           *(double *)(Aux._0_8_ + (long)(i * rhs->n_cols_ + i) * 8);
      *(undefined8 *)(Aux._0_8_ + (long)(local_64 * rhs->n_cols_ + i) * 8) = 0;
      i_2 = i;
      while (i_2 = i_2 + 1, i_2 < Aux.v_._4_4_) {
        *(double *)(Aux._0_8_ + (long)(local_64 * rhs->n_cols_ + i_2) * 8) =
             -_l * *(double *)(Aux._0_8_ + (long)(i * rhs->n_cols_ + i_2) * 8) +
             *(double *)(Aux._0_8_ + (long)(local_64 * rhs->n_cols_ + i_2) * 8);
      }
      this_01->v_[local_64] = -_l * this_01->v_[i] + this_01->v_[local_64];
      iVar1 = local_64;
    }
  }
  s._7_1_ = 0;
  Mat(this,Aux.v_._4_4_);
  this->v_[Aux.v_._4_4_ + -1] =
       this_01->v_[Aux.v_._4_4_ + -1] /
       *(double *)(Aux._0_8_ + (long)((Aux.v_._4_4_ + -1) * rhs->n_cols_ + Aux.v_._4_4_ + -1) * 8);
  for (s._0_4_ = Aux.v_._4_4_ + -2; -1 < s._0_4_; s._0_4_ = s._0_4_ + -1) {
    dStack_78 = 0.0;
    local_7c = s._0_4_;
    while (local_7c = local_7c + 1, local_7c < Aux.v_._4_4_) {
      dStack_78 = -*(double *)(Aux._0_8_ + (long)(s._0_4_ * rhs->n_cols_ + local_7c) * 8) *
                  this->v_[local_7c] + dStack_78;
    }
    this->v_[s._0_4_] =
         (this_01->v_[s._0_4_] + dStack_78) /
         *(double *)(Aux._0_8_ + (long)(s._0_4_ * rhs->n_cols_ + s._0_4_) * 8);
  }
  operator~(&local_90);
  ~Mat(&local_90);
  s._7_1_ = 1;
  ~Mat((Mat *)local_38);
  MVar4.v_ = extraout_RDX;
  MVar4._0_8_ = this;
  return MVar4;
}

Assistant:

Mat Mat::GaussLin(const Mat rhs,int n) const
{
	Mat Aux = (*this);
	if ( (Aux.n_rows_!=rhs.Size() )) {
    cerr << "ERROR: Invalid dimension in gaussLin" << endl;
    exit(1);
	};
	double m;
	for (int k=0; k<n-1; k++ )
	{
		int l=k;
		// Rearrangement
		for (int i=k+1; i<n; i++)
		{
			if (abs(Aux(i,k)) > abs(Aux(l,k))) 
				l=i;
		}
		if (l!=k)
		{
			for (int j = k; j < n; j++)
			{
				m = Aux(k,j);
				Aux.v_[k*n_cols_+j] = Aux.v_[l*n_cols_+j];
				Aux.v_[l*n_cols_+j] = m;
			}
			m = rhs.v_[k];
			rhs.v_[k] = rhs.v_[l];
		    rhs.v_[l] = m;
		}
		for (int i = k+1; i < n; i++)
		{
			m = Aux.v_[i*n_cols_+k] / Aux.v_[k*n_cols_+k];
			Aux.v_[i*n_cols_+k] = 0.0;
			for ( int j = k+1; j < n; j++)
			{
				Aux.v_[i*n_cols_ + j] = Aux.v_[i*n_cols_ + j] - m * Aux.v_[k*n_cols_+j];
			}
			rhs.v_[i] = rhs.v_[i] - m * rhs.v_[k] ; 
		}
	}
	Mat X(n);
	X.v_[n-1] = rhs.v_[n-1] / Aux.v_[(n-1)*n_cols_+n-1];
	for (int i = n-2 ;i >-1 ;i--)
	{
		double s = 0.0;		
		for (int j = i+1 ; j < n; j++)
			s = s - Aux.v_[i*n_cols_ + j] * X.v_[j];
		X.v_[i] = (rhs.v_[i] + s)/ Aux.v_[i*n_cols_ + i];
	}
	~Aux;
	return X;
}